

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  int iVar1;
  Rep *pRVar2;
  LogMessage *pLVar3;
  LogFinisher local_99;
  LogMessage local_98;
  LogMessage local_60;
  
  if (this == other) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/repeated_field.h"
               ,0x976);
    pLVar3 = LogMessage::operator<<(&local_60,"CHECK failed: this != other: ");
    LogFinisher::operator=((LogFinisher *)&local_98,pLVar3);
    LogMessage::~LogMessage(&local_60);
  }
  if (this->arena_ != other->arena_) {
    LogMessage::LogMessage
              (&local_98,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/repeated_field.h"
               ,0x977);
    pLVar3 = LogMessage::operator<<
                       (&local_98,
                        "CHECK failed: GetArenaNoVirtual() == other->GetArenaNoVirtual(): ");
    LogFinisher::operator=(&local_99,pLVar3);
    LogMessage::~LogMessage(&local_98);
  }
  pRVar2 = this->rep_;
  this->rep_ = other->rep_;
  other->rep_ = pRVar2;
  iVar1 = this->current_size_;
  this->current_size_ = other->current_size_;
  other->current_size_ = iVar1;
  iVar1 = this->total_size_;
  this->total_size_ = other->total_size_;
  other->total_size_ = iVar1;
  return;
}

Assistant:

void RepeatedPtrFieldBase::InternalSwap(RepeatedPtrFieldBase* other) {
  GOOGLE_DCHECK(this != other);
  GOOGLE_DCHECK(GetArenaNoVirtual() == other->GetArenaNoVirtual());

  std::swap(rep_, other->rep_);
  std::swap(current_size_, other->current_size_);
  std::swap(total_size_, other->total_size_);
}